

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

bool __thiscall
nlohmann::detail::
iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::operator==(iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
             *this,iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   *other)

{
  pointer pbVar1;
  invalid_iterator *__return_storage_ptr__;
  bool bVar2;
  string local_40;
  
  pbVar1 = this->m_object;
  if (pbVar1 != other->m_object) {
    __return_storage_ptr__ = (invalid_iterator *)__cxa_allocate_exception(0x20);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"cannot compare iterators of different containers","");
    invalid_iterator::create(__return_storage_ptr__,0xd4,&local_40);
    __cxa_throw(__return_storage_ptr__,&invalid_iterator::typeinfo,exception::~exception);
  }
  if (pbVar1 != (pointer)0x0) {
    if (pbVar1->m_type == array) {
      bVar2 = (this->m_it).array_iterator._M_current == (other->m_it).array_iterator._M_current;
    }
    else if (pbVar1->m_type == object) {
      bVar2 = (this->m_it).object_iterator._M_node == (other->m_it).object_iterator._M_node;
    }
    else {
      bVar2 = (this->m_it).primitive_iterator.m_it == (other->m_it).primitive_iterator.m_it;
    }
    return bVar2;
  }
  __assert_fail("m_object != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Ethiraric[P]cpptalksindex/deps/json/include/nlohmann/json.hpp"
                ,0x25ef,
                "bool nlohmann::detail::iter_impl<const nlohmann::basic_json<>>::operator==(const iter_impl<BasicJsonType> &) const [BasicJsonType = const nlohmann::basic_json<>]"
               );
}

Assistant:

bool operator==(const iter_impl& other) const
    {
        // if objects are not the same, the comparison is undefined
        if (JSON_HEDLEY_UNLIKELY(m_object != other.m_object))
        {
            JSON_THROW(invalid_iterator::create(212, "cannot compare iterators of different containers"));
        }

        assert(m_object != nullptr);

        switch (m_object->m_type)
        {
            case value_t::object:
                return (m_it.object_iterator == other.m_it.object_iterator);

            case value_t::array:
                return (m_it.array_iterator == other.m_it.array_iterator);

            default:
                return (m_it.primitive_iterator == other.m_it.primitive_iterator);
        }
    }